

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O2

void wabt::anon_unknown_16::NameGenerator::GenerateName
               (char *prefix,Index index,uint disambiguator,string *str)

{
  string local_68;
  string local_48;
  
  std::__cxx11::string::assign((string *)str,prefix);
  if (index != 0xffffffff) {
    std::__cxx11::to_string(&local_48,index);
    std::__cxx11::string::append((string *)str,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (disambiguator != 0) {
    std::__cxx11::to_string(&local_68,disambiguator);
    std::operator+(&local_48,'_',&local_68);
    std::__cxx11::string::append((string *)str,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void NameGenerator::GenerateName(const char* prefix,
                                 Index index,
                                 unsigned disambiguator,
                                 std::string* str) {
  *str = prefix;
  if (index != kInvalidIndex) {
    *str += std::to_string(index);
  }
  if (disambiguator != 0) {
    *str += '_' + std::to_string(disambiguator);
  }
}